

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProxyClient.cpp
# Opt level: O3

void __thiscall ProxyClient::~ProxyClient(ProxyClient *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Manager_type p_Var2;
  pointer pcVar3;
  Cypher *pCVar4;
  Client *pCVar5;
  _Head_base<0UL,_net_uv::TCPServer_*,_false> _Var6;
  pointer *__ptr;
  _Any_data local_28;
  code *local_18;
  undefined8 uStack_10;
  
  free(this->m_sendBuffer);
  local_18 = (code *)0x0;
  uStack_10 = 0;
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  stop(this,(function<void_()> *)&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  clear(this);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_ProxyClient::SessionData>,_std::allocator<std::pair<const_unsigned_int,_ProxyClient::SessionData>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->m_sessionDataMap)._M_h);
  net_uv::UVTimer::~UVTimer(&this->m_update);
  net_uv::UVLoop::~UVLoop(&this->m_loop);
  p_Var2 = (this->m_stopCall).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->m_stopCall,(_Any_data *)&this->m_stopCall,__destroy_functor);
  }
  pcVar3 = (this->m_password)._M_dataplus._M_p;
  paVar1 = &(this->m_password).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->m_username)._M_dataplus._M_p;
  paVar1 = &(this->m_username).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->m_remoteIP)._M_dataplus._M_p;
  paVar1 = &(this->m_remoteIP).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pCVar4 = (this->m_cypher)._M_t.super___uniq_ptr_impl<Cypher,_std::default_delete<Cypher>_>._M_t.
           super__Tuple_impl<0UL,_Cypher_*,_std::default_delete<Cypher>_>.
           super__Head_base<0UL,_Cypher_*,_false>._M_head_impl;
  if (pCVar4 != (Cypher *)0x0) {
    (*pCVar4->_vptr_Cypher[1])();
  }
  (this->m_cypher)._M_t.super___uniq_ptr_impl<Cypher,_std::default_delete<Cypher>_>._M_t.
  super__Tuple_impl<0UL,_Cypher_*,_std::default_delete<Cypher>_>.
  super__Head_base<0UL,_Cypher_*,_false>._M_head_impl = (Cypher *)0x0;
  pCVar5 = (this->m_pipe)._M_t.
           super___uniq_ptr_impl<net_uv::Client,_std::default_delete<net_uv::Client>_>._M_t.
           super__Tuple_impl<0UL,_net_uv::Client_*,_std::default_delete<net_uv::Client>_>.
           super__Head_base<0UL,_net_uv::Client_*,_false>._M_head_impl;
  if (pCVar5 != (Client *)0x0) {
    (**(code **)((long)(pCVar5->super_Runnable)._vptr_Runnable + 8))();
  }
  (this->m_pipe)._M_t.super___uniq_ptr_impl<net_uv::Client,_std::default_delete<net_uv::Client>_>.
  _M_t.super__Tuple_impl<0UL,_net_uv::Client_*,_std::default_delete<net_uv::Client>_>.
  super__Head_base<0UL,_net_uv::Client_*,_false>._M_head_impl = (Client *)0x0;
  _Var6._M_head_impl =
       (this->m_tcpSvr)._M_t.
       super___uniq_ptr_impl<net_uv::TCPServer,_std::default_delete<net_uv::TCPServer>_>._M_t.
       super__Tuple_impl<0UL,_net_uv::TCPServer_*,_std::default_delete<net_uv::TCPServer>_>.
       super__Head_base<0UL,_net_uv::TCPServer_*,_false>._M_head_impl;
  if (_Var6._M_head_impl != (TCPServer *)0x0) {
    (**(code **)(*(long *)&(_Var6._M_head_impl)->super_Server + 8))();
  }
  (this->m_tcpSvr)._M_t.
  super___uniq_ptr_impl<net_uv::TCPServer,_std::default_delete<net_uv::TCPServer>_>._M_t.
  super__Tuple_impl<0UL,_net_uv::TCPServer_*,_std::default_delete<net_uv::TCPServer>_>.
  super__Head_base<0UL,_net_uv::TCPServer_*,_false>._M_head_impl = (TCPServer *)0x0;
  return;
}

Assistant:

ProxyClient::~ProxyClient()
{
	fc_free(m_sendBuffer);
	stop(NULL);
	clear();
}